

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall
Scene::render(Scene *this,Shadow shadow,bool light_projection,int display_w,int display_h,
             ResourcePack *resource_pack,Camera *camera)

{
  GLenum err_00;
  ostream *poVar1;
  char *pcVar2;
  GLenum err;
  ResourcePack *resource_pack_local;
  int display_h_local;
  int display_w_local;
  bool light_projection_local;
  Shadow shadow_local;
  Scene *this_local;
  
  if (shadow != NoShadow) {
    render_pass(this,GenerateDepthMap,shadow,light_projection,display_w,display_h,resource_pack,
                camera);
  }
  render_pass(this,Display,shadow,light_projection,display_w,display_h,resource_pack,camera);
  while( true ) {
    err_00 = glGetError();
    if (err_00 == 0) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"GL Error: ");
    pcVar2 = get_gl_err_str(err_00);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Scene::render(Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    if (shadow != Shadow::NoShadow) {
        // Generate depth map
        render_pass(RenderPass::GenerateDepthMap, shadow, light_projection, display_w, display_h, resource_pack, camera);
    }

    // Render objects
    render_pass(RenderPass::Display, shadow, light_projection, display_w, display_h, resource_pack, camera);

    // Debug OpenGl errors
    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR) {
        std::cout << "GL Error: " << get_gl_err_str(err) << std::endl;
    }
}